

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.h
# Opt level: O0

uint32 __thiscall
google::protobuf::internal::ReflectionSchema::HasBitsOffset(ReflectionSchema *this)

{
  long in_RDI;
  
  return *(uint32 *)(in_RDI + 0x18);
}

Assistant:

uint32 HasBitsOffset() const {
    GOOGLE_DCHECK(HasHasbits());
    return static_cast<uint32>(has_bits_offset_);
  }